

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Div_f32(w3Interp *this)

{
  float *pfVar1;
  float fVar2;
  
  fVar2 = w3Stack::pop_f32(&this->super_w3Stack);
  pfVar1 = w3Stack::f32(&this->super_w3Stack);
  *pfVar1 = *pfVar1 / fVar2;
  return;
}

Assistant:

INTERP (Div_f32)
{
    const float a = pop_f32 ();
    f32 () /= a;
}